

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

void __thiscall
Diligent::RefCntAutoPtr<Diligent::IFileStream>::DoublePtrHelper<Diligent::IFileStream>::
~DoublePtrHelper(DoublePtrHelper<Diligent::IFileStream> *this)

{
  IFileStream *pIVar1;
  DoublePtrHelper<Diligent::IFileStream> *this_local;
  
  if (this->m_pAutoPtr != (RefCntAutoPtr<Diligent::IFileStream> *)0x0) {
    pIVar1 = Diligent::RefCntAutoPtr::operator_cast_to_IFileStream_
                       ((RefCntAutoPtr *)this->m_pAutoPtr);
    if (pIVar1 != this->NewRawPtr) {
      RefCntAutoPtr<Diligent::IFileStream>::Attach(this->m_pAutoPtr,this->NewRawPtr);
    }
  }
  return;
}

Assistant:

~DoublePtrHelper()
        {
            if (m_pAutoPtr && *m_pAutoPtr != static_cast<T*>(NewRawPtr))
            {
                m_pAutoPtr->Attach(static_cast<T*>(NewRawPtr));
            }
        }